

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.h
# Opt level: O0

longdouble * __thiscall
TPZMatrix<long_double>::Get(TPZMatrix<long_double> *this,int64_t row,int64_t col)

{
  longdouble *plVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  
  plVar1 = (longdouble *)(**(code **)(*in_RDI + 0x120))(in_RDI,in_RSI,in_RDX);
  return plVar1;
}

Assistant:

inline const TVar TPZMatrix<TVar>::Get(const int64_t row, const int64_t col ) const {
	// bound checking
#ifdef PZDEBUG
	if ( (row >= Rows()) || (col >= Cols()) || row <0 || col <0 ) {
		Error("TPZMatrix::Get", "Index out of range");
        DebugStop();
	}
#endif
	return( GetVal( row, col ) );
}